

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipatchtexture.cpp
# Opt level: O1

void __thiscall FMultiPatchTexture::~FMultiPatchTexture(FMultiPatchTexture *this)

{
  FRemapTable *this_00;
  long lVar1;
  long lVar2;
  
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FMultiPatchTexture_008658a0;
  if (this->Pixels != (BYTE *)0x0) {
    operator_delete__(this->Pixels);
    this->Pixels = (BYTE *)0x0;
  }
  if (this->Parts != (TexPart *)0x0) {
    if (0 < this->NumParts) {
      lVar2 = 8;
      lVar1 = 0;
      do {
        this_00 = *(FRemapTable **)((long)&this->Parts->OriginX + lVar2);
        if (this_00 != (FRemapTable *)0x0) {
          FRemapTable::~FRemapTable(this_00);
          operator_delete(this_00,0x20);
        }
        lVar1 = lVar1 + 1;
        lVar2 = lVar2 + 0x28;
      } while (lVar1 < this->NumParts);
    }
    if (this->Parts != (TexPart *)0x0) {
      operator_delete__(this->Parts);
    }
    this->Parts = (TexPart *)0x0;
  }
  if (this->Spans != (Span **)0x0) {
    FTexture::FreeSpans(&this->super_FTexture,this->Spans);
    this->Spans = (Span **)0x0;
  }
  FTexture::~FTexture(&this->super_FTexture);
  return;
}

Assistant:

FMultiPatchTexture::~FMultiPatchTexture ()
{
	Unload ();
	if (Parts != NULL)
	{
		for(int i=0; i<NumParts;i++)
		{
			if (Parts[i].Translation != NULL) delete Parts[i].Translation;
		}
		delete[] Parts;
		Parts = NULL;
	}
	if (Spans != NULL)
	{
		FreeSpans (Spans);
		Spans = NULL;
	}
}